

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin>
               (GetterXsYs<double> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    dVar2 = *(double *)((long)getter->Ys + lVar9);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar5 = log10(*(double *)((long)getter->Xs + lVar9) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar7->CurrentPlot;
    dVar6 = (pIVar4->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar3 = pIVar7->PixelRange[iVar10].Min;
    local_3c.y = (float)(pIVar7->My[iVar10] * (dVar2 - pIVar4->YAxis[iVar10].Range.Min) +
                        (double)IVar3.y);
    local_3c.x = (float)(pIVar7->Mx *
                         (((double)(float)(dVar5 / pIVar7->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar3.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLin> *)local_58,
               DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    dVar2 = *(double *)((long)getter->Ys + lVar9);
    dVar5 = log10(*(double *)((long)getter->Xs + lVar9) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar7->CurrentPlot;
    dVar6 = (pIVar4->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar3 = pIVar7->PixelRange[iVar10].Min;
    local_58._4_4_ =
         (float)(pIVar7->My[iVar10] * (dVar2 - pIVar4->YAxis[iVar10].Range.Min) + (double)IVar3.y);
    local_58._0_4_ =
         (float)(pIVar7->Mx *
                 (((double)(float)(dVar5 / pIVar7->LogDenX) * ((pIVar4->XAxis).Range.Max - dVar6) +
                  dVar6) - dVar6) + (double)IVar3.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        dVar2 = *(double *)((long)getter->Ys + lVar9);
        dVar5 = log10(*(double *)((long)getter->Xs + lVar9) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar4 = pIVar8->CurrentPlot;
        dVar6 = (pIVar4->XAxis).Range.Min;
        iVar10 = transformer->YAxis;
        IVar3 = pIVar8->PixelRange[iVar10].Min;
        fVar12 = (float)(pIVar8->Mx *
                         (((double)(float)(dVar5 / pIVar8->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar3.x);
        fVar13 = (float)(pIVar8->My[iVar10] * (dVar2 - pIVar4->YAxis[iVar10].Range.Min) +
                        (double)IVar3.y);
        local_60.y = fVar13;
        local_60.x = fVar12;
        pIVar4 = pIVar7->CurrentPlot;
        fVar14 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar14 = fVar13;
        }
        if ((fVar14 < (pIVar4->PlotRect).Max.y) &&
           (fVar14 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                            local_58._4_4_ & -(uint)(fVar13 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar14 && fVar14 != *pfVar1)) {
          fVar14 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar14 = fVar12;
          }
          if ((fVar14 < (pIVar4->PlotRect).Max.x) &&
             (fVar14 = (float)(-(uint)(fVar12 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12),
             (pIVar4->PlotRect).Min.x <= fVar14 && fVar14 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}